

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void ra_evictset(ASMState *as,RegSet drop)

{
  uint uVar1;
  uint uVar2;
  Reg r_1;
  Reg r;
  RegSet work;
  RegSet drop_local;
  ASMState *as_local;
  
  as->modset = drop | as->modset;
  r_1 = drop & (as->freeset ^ 0xffffffff) & 0xffff0000;
  do {
    if (r_1 == 0) {
      r_1 = drop & (as->freeset ^ 0xffffffff);
      do {
        if (r_1 == 0) {
          return;
        }
        uVar1 = 0;
        for (uVar2 = r_1; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x80000000) {
          uVar1 = uVar1 + 1;
        }
        ra_restore(as,as->cost[uVar1] & 0xffff);
        r_1 = (1 << ((byte)uVar1 & 0x1f) ^ 0xffffffffU) & r_1;
      } while (as->mclim <= as->mcp);
      asm_mclimit(as);
    }
    uVar1 = 0;
    for (uVar2 = r_1; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x80000000) {
      uVar1 = uVar1 + 1;
    }
    ra_restore(as,as->cost[uVar1] & 0xffff);
    r_1 = (1 << ((byte)uVar1 & 0x1f) ^ 0xffffffffU) & r_1;
  } while (as->mclim <= as->mcp);
  asm_mclimit(as);
}

Assistant:

static void ra_evictset(ASMState *as, RegSet drop)
{
  RegSet work;
  as->modset |= drop;
#if !LJ_SOFTFP
  work = (drop & ~as->freeset) & RSET_FPR;
  while (work) {
    Reg r = rset_pickbot(work);
    ra_restore(as, regcost_ref(as->cost[r]));
    rset_clear(work, r);
    checkmclim(as);
  }
#endif
  work = (drop & ~as->freeset);
  while (work) {
    Reg r = rset_pickbot(work);
    ra_restore(as, regcost_ref(as->cost[r]));
    rset_clear(work, r);
    checkmclim(as);
  }
}